

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweep.cpp
# Opt level: O1

void __thiscall
Memory::RecyclerSweep::
MergePendingNewHeapBlockList<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
          (RecyclerSweep *this)

{
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *list;
  
  list = (this->finalizableData).pendingMergeNewHeapBlockList;
  (this->finalizableData).pendingMergeNewHeapBlockList =
       (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
  HeapBlockList::
  ForEachEditing<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>,Memory::RecyclerSweep::MergePendingNewHeapBlockList<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>()::_lambda(Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            (list,(SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
             (anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

void
RecyclerSweep::MergePendingNewHeapBlockList()
{
    TBlockType *& blockList = this->GetData<TBlockType>().pendingMergeNewHeapBlockList;
    TBlockType * list = blockList;
    blockList = nullptr;
    HeapBlockList::ForEachEditing(list, [this](TBlockType * heapBlock)
    {
        auto& bucket = this->heapInfo->GetBucket<TBlockType::RequiredAttributes>(heapBlock->GetObjectSize());
        bucket.MergeNewHeapBlock(heapBlock);
    });
}